

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint_t calcChecksum16(uint8_t *p0,size_t size)

{
  uint_t uVar1;
  ushort *puVar2;
  
  puVar2 = (ushort *)(p0 + (size & 0xfffffffffffffffe));
  uVar1 = 0;
  for (; p0 < puVar2; p0 = (uint8_t *)((long)p0 + 2)) {
    uVar1 = uVar1 + (ushort)(*(ushort *)p0 << 8 | *(ushort *)p0 >> 8);
  }
  if ((size & 1) != 0) {
    uVar1 = uVar1 + (uint)(byte)*(ushort *)p0 * 0x100;
  }
  return uVar1;
}

Assistant:

uint_t calcChecksum16(
	const uint8_t* p0,
	size_t size
) {
	uint16_t const* p = (uint16_t const*)p0;
	void const* end = p0 + (size & ~1);

	uint_t checksum = 0;

	for (; p < end; p++)
		checksum += htons(*p);

	if (size & 1)
		checksum += *(uint8_t const*)p << 8;

	return checksum;
}